

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall
HEkkDual::interpretDualEdgeWeightStrategy(HEkkDual *this,HighsInt dual_edge_weight_strategy)

{
  uint in_ESI;
  long in_RDI;
  
  if (in_ESI == 0xffffffff) {
    *(undefined4 *)(in_RDI + 0xac) = 2;
    *(undefined1 *)(in_RDI + 0xb0) = 1;
  }
  else if (in_ESI == 0) {
    *(undefined4 *)(in_RDI + 0xac) = 0;
  }
  else if (in_ESI == 1) {
    *(undefined4 *)(in_RDI + 0xac) = 1;
  }
  else if (in_ESI == 2) {
    *(undefined4 *)(in_RDI + 0xac) = 2;
    *(undefined1 *)(in_RDI + 0xb0) = 0;
  }
  else {
    highsLogDev((HighsLogOptions *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x380),kInfo,
                "HEkkDual::interpretDualEdgeWeightStrategy: unrecognised dual_edge_weight_strategy = %d - using dual steepest edge with possible switch to Devex\n"
                ,(ulong)in_ESI);
    *(undefined4 *)(in_RDI + 0xac) = 2;
    *(undefined1 *)(in_RDI + 0xb0) = 1;
  }
  return;
}

Assistant:

void HEkkDual::interpretDualEdgeWeightStrategy(
    const HighsInt dual_edge_weight_strategy) {
  if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyChoose) {
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = true;
  } else if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyDantzig) {
    edge_weight_mode = EdgeWeightMode::kDantzig;
  } else if (dual_edge_weight_strategy == kSimplexEdgeWeightStrategyDevex) {
    edge_weight_mode = EdgeWeightMode::kDevex;
  } else if (dual_edge_weight_strategy ==
             kSimplexEdgeWeightStrategySteepestEdge) {
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = false;
  } else {
    assert(1 == 0);
    highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kInfo,
                "HEkkDual::interpretDualEdgeWeightStrategy: "
                "unrecognised dual_edge_weight_strategy = %" HIGHSINT_FORMAT
                " - using "
                "dual steepest edge with possible switch to Devex\n",
                dual_edge_weight_strategy);
    edge_weight_mode = EdgeWeightMode::kSteepestEdge;
    allow_dual_steepest_edge_to_devex_switch = true;
  }
}